

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O2

void Js::FunctionBody::GetShortNameFromUrl(LPCWSTR pchUrl,LPWSTR pchShortName,size_t cchBuffer)

{
  char16_t *pcVar1;
  char16_t *_Src;
  
  pcVar1 = PAL_wcsrchr(pchUrl,L'/');
  if (pcVar1 == (char16_t *)0x0) {
    pcVar1 = PAL_wcsrchr(pchUrl,L'\\');
  }
  _Src = pcVar1 + 1;
  if (pcVar1 == (char16_t *)0x0) {
    _Src = pchUrl;
  }
  wcscpy_s(pchShortName,cchBuffer,_Src);
  return;
}

Assistant:

void FunctionBody::GetShortNameFromUrl(__in LPCWSTR pchUrl, _Out_writes_z_(cchBuffer) LPWSTR pchShortName, __in size_t cchBuffer)
    {
        LPCWSTR pchFile = wcsrchr(pchUrl, _u('/'));
        if (pchFile == nullptr)
        {
            pchFile = wcsrchr(pchUrl, _u('\\'));
        }

        LPCWSTR pchToCopy = pchUrl;

        if (pchFile != nullptr)
        {
            pchToCopy = pchFile + 1;
        }

        wcscpy_s(pchShortName, cchBuffer, pchToCopy);
    }